

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::ServiceDescriptorProto::_InternalParse
          (ServiceDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Rep *pRVar5;
  MethodDescriptorProto *msg;
  ServiceOptions *msg_00;
  char cVar6;
  uint32 res;
  uint tag;
  int iVar7;
  Arena *pAVar8;
  string *s;
  char *ptr_00;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_bool> pVar10;
  
  this_00 = &this->name_;
LAB_0017290e:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)(byte *)ptr;
      }
      pVar10 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar10.first;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)(byte *)ptr;
      }
    }
    bVar1 = *ptr;
    pVar9.second._0_1_ = bVar1;
    pVar9.first = (char *)((byte *)ptr + 1);
    pVar9._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar9 = internal::ReadTagFallback(ptr,res);
        if (pVar9.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pVar9.second = res;
        pVar9.first = (char *)((byte *)ptr + 2);
        pVar9._12_4_ = 0;
      }
    }
    ptr_00 = pVar9.first;
    tag = pVar9.second;
    uVar4 = (uint)(pVar9._8_8_ >> 3) & 0x1fffffff;
    cVar6 = (char)pVar9.second;
    if (uVar4 == 3) {
      if (cVar6 != '\x1a') goto LAB_00172a9b;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      msg_00 = this->options_;
      if (msg_00 == (ServiceOptions *)0x0) {
        pAVar8 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
        }
        msg_00 = Arena::CreateMaybeMessage<google::protobuf::ServiceOptions>(pAVar8);
        this->options_ = msg_00;
      }
      ptr = internal::ParseContext::ParseMessage<google::protobuf::ServiceOptions>
                      (ctx,msg_00,ptr_00);
    }
    else {
      if (uVar4 == 2) {
        if (cVar6 == '\x12') {
          ptr = ptr_00 + -1;
          do {
            pRVar5 = (this->method_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar5 == (Rep *)0x0) {
              iVar7 = (this->method_).super_RepeatedPtrFieldBase.total_size_;
LAB_001729d8:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->method_).super_RepeatedPtrFieldBase,iVar7 + 1);
              pRVar5 = (this->method_).super_RepeatedPtrFieldBase.rep_;
              iVar7 = pRVar5->allocated_size;
LAB_001729e8:
              pRVar5->allocated_size = iVar7 + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::MethodDescriptorProto>
                              ((this->method_).super_RepeatedPtrFieldBase.arena_);
              pRVar5 = (this->method_).super_RepeatedPtrFieldBase.rep_;
              iVar7 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
              (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
              pRVar5->elements[iVar7] = msg;
            }
            else {
              iVar3 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
              iVar7 = pRVar5->allocated_size;
              if (iVar7 <= iVar3) {
                if (iVar7 == (this->method_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_001729d8;
                goto LAB_001729e8;
              }
              (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (MethodDescriptorProto *)pRVar5->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::MethodDescriptorProto>
                            (ctx,msg,(char *)((byte *)ptr + 1));
            if ((byte *)ptr == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x12));
          goto LAB_0017290e;
        }
      }
      else if ((uVar4 == 1) && (cVar6 == '\n')) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar8 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
        }
        s = this_00->ptr_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          s = this_00->ptr_;
        }
        ptr = internal::InlineGreedyStringParser(s,ptr_00,ctx);
        goto LAB_00172aba;
      }
LAB_00172a9b:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        return ptr_00;
      }
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr_00,ctx);
    }
LAB_00172aba:
    if ((byte *)ptr == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ServiceDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.ServiceDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.MethodDescriptorProto method = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_method(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.ServiceOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}